

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_skylight.cpp
# Opt level: O2

void __thiscall ON_Skylight::ON_Skylight(ON_Skylight *this,ON_Skylight *sl)

{
  CImpl *pCVar1;
  
  this->_vptr_ON_Skylight = (_func_int **)&PTR__ON_Skylight_0082b818;
  pCVar1 = (CImpl *)operator_new(0x40);
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (pCVar1->super_ON_InternalXMLImpl)._local_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._model_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._vptr_ON_InternalXMLImpl =
       (_func_int **)&PTR__ON_InternalXMLImpl_0082b890;
  this->m_impl = pCVar1;
  operator=(this,sl);
  return;
}

Assistant:

ON_Skylight::ON_Skylight(const ON_Skylight& sl)
{
  m_impl = new CImpl;
  operator = (sl);
}